

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalStreamingWindow::ExecuteShifted
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *delayed,
          DataChunk *input,DataChunk *output,GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  DataChunk *this_00;
  idx_t source_offset;
  idx_t source_count;
  idx_t source_count_00;
  _func_int **pp_Var1;
  idx_t iVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  
  this_00 = (DataChunk *)(state_p + 0x15);
  source_offset = output->count;
  source_count = input->count;
  source_count_00 = delayed->count;
  pp_Var1 = state_p[0x19]._vptr_OperatorState;
  DataChunk::Reset(this_00);
  state_p[0x19]._vptr_OperatorState = pp_Var1;
  DataChunk::Copy(delayed,this_00,0);
  iVar2 = delayed->capacity;
  DataChunk::Reset(delayed);
  delayed->capacity = iVar2;
  if ((delayed->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (delayed->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,__n)
      ;
      Vector::Reference(pvVar3,pvVar4);
      pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,__n)
      ;
      pvVar4 = vector<duckdb::Vector,_true>::operator[](&delayed->data,__n);
      VectorOperations::Copy(pvVar3,pvVar4,source_count_00,source_offset,0);
      pvVar3 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
      pvVar4 = vector<duckdb::Vector,_true>::operator[](&delayed->data,__n);
      VectorOperations::Copy(pvVar3,pvVar4,source_count,0,source_count_00 - source_offset);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(delayed->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(delayed->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  delayed->count = (source_count - source_offset) + source_count_00;
  ExecuteFunctions(this,context,output,delayed,gstate_p,state_p);
  return;
}

Assistant:

void PhysicalStreamingWindow::ExecuteShifted(ExecutionContext &context, DataChunk &delayed, DataChunk &input,
                                             DataChunk &output, GlobalOperatorState &gstate_p,
                                             OperatorState &state_p) const {
	auto &state = state_p.Cast<StreamingWindowState>();
	auto &shifted = state.shifted;

	idx_t out = output.size();
	idx_t in = input.size();
	idx_t delay = delayed.size();
	D_ASSERT(out <= delay);

	state.Reset(shifted);
	// shifted = delayed
	delayed.Copy(shifted);
	state.Reset(delayed);
	for (idx_t col_idx = 0; col_idx < delayed.data.size(); ++col_idx) {
		// output[0:out] = delayed[0:out]
		output.data[col_idx].Reference(shifted.data[col_idx]);
		// delayed[0:out] = delayed[out:delay-out]
		VectorOperations::Copy(shifted.data[col_idx], delayed.data[col_idx], delay, out, 0);
		// delayed[delay-out:delay-out+in] = input[0:in]
		VectorOperations::Copy(input.data[col_idx], delayed.data[col_idx], in, 0, delay - out);
	}
	delayed.SetCardinality(delay - out + in);

	ExecuteFunctions(context, output, delayed, gstate_p, state_p);
}